

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O3

void __thiscall Ptex::v2_4::PtexSeparableKernel::flipU(PtexSeparableKernel *this)

{
  float fVar1;
  int iVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  
  iVar2 = this->uw;
  this->u = (1 << ((this->res).ulog2 & 0x1fU)) - (this->u + iVar2);
  pfVar3 = this->ku;
  pfVar5 = pfVar3 + (long)iVar2 + -1;
  if (pfVar3 < pfVar5 && iVar2 != 0) {
    do {
      pfVar4 = pfVar3 + 1;
      fVar1 = *pfVar3;
      *pfVar3 = *pfVar5;
      *pfVar5 = fVar1;
      pfVar5 = pfVar5 + -1;
      pfVar3 = pfVar4;
    } while (pfVar4 < pfVar5);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }